

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type-printing.h
# Opt level: O0

TypeNames * __thiscall
wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
getNames(TypeNames *__return_storage_ptr__,
        IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
        *this,HeapType type)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true> local_30;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true> local_28;
  iterator it;
  IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
  *this_local;
  HeapType type_local;
  
  it.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>)
       (_Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>)this;
  this_local = (IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                *)type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
       ::find(&this->names,(key_type *)&this_local);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
       ::end(&this->names);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>::
             operator->((_Node_iterator<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_false,_true>
                         *)&local_28);
    TypeNames::TypeNames(__return_storage_ptr__,&ppVar2->second);
  }
  else {
    IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::getNames
              (__return_storage_ptr__,this->fallback,(HeapType)this_local);
  }
  return __return_storage_ptr__;
}

Assistant:

TypeNames getNames(HeapType type) {
    if (auto it = names.find(type); it != names.end()) {
      return it->second;
    } else {
      return fallback.getNames(type);
    }
  }